

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  undefined1 auVar1 [16];
  pointer pbVar2;
  undefined8 uVar3;
  int factor;
  int32_t k;
  long lVar4;
  istream *piVar5;
  string queryWord;
  string prompt;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  FastText fasttext;
  Args local_370;
  Args local_1d0;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
  if (lVar4 == 3) {
    k = 10;
  }
  else {
    if (lVar4 != 4) {
      printNNUsage();
      exit(1);
    }
    k = std::__cxx11::stoi(pbVar2 + 3,(size_t *)0x0,10);
  }
  ::fasttext::FastText::FastText(&fasttext);
  std::__cxx11::string::string
            ((string *)&local_370,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  ::fasttext::FastText::loadModel(&fasttext,(string *)&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&prompt,"Query word? ",(allocator *)&local_370);
  std::operator<<((ostream *)&std::cout,(string *)&prompt);
  queryWord._M_dataplus._M_p = (pointer)&queryWord.field_2;
  queryWord._M_string_length = 0;
  queryWord.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar5 = std::operator>>((istream *)&std::cin,(string *)&queryWord);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    ::fasttext::FastText::getArgs(&local_370,&fasttext);
    factor = local_370.factor;
    ::fasttext::FastText::getArgs(&local_1d0,&fasttext);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1d0.addWo;
    uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,4);
    ::fasttext::FastText::getNNMod(&local_410,&fasttext,&queryWord,k,factor,(bool)((byte)uVar3 & 1))
    ;
    printPredictions(&local_410,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_410);
    ::fasttext::Args::~Args(&local_1d0);
    ::fasttext::Args::~Args(&local_370);
    std::operator<<((ostream *)&std::cout,(string *)&prompt);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;
  std::string queryWord;
  while (std::cin >> queryWord) {
//    std::cout << queryWord;
    printPredictions(fasttext.getNNMod(queryWord, k, fasttext.getArgs().factor, fasttext.getArgs().addWo), true, true);
    std::cout << prompt;
  }
  exit(0);
}